

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_scalar_function_info.cpp
# Opt level: O3

string * __thiscall
duckdb::AddScalarFunctionOverloadInfo::ToString_abi_cxx11_
          (string *__return_storage_ptr__,AddScalarFunctionOverloadInfo *this)

{
  NotImplementedException *this_00;
  string local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"NOT PARSABLE CURRENTLY","")
  ;
  NotImplementedException::NotImplementedException(this_00,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string AddScalarFunctionOverloadInfo::ToString() const {
	throw NotImplementedException("NOT PARSABLE CURRENTLY");
}